

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O0

ExecutionState __thiscall
Js::FunctionExecutionStateMachine::GetDefaultInterpreterExecutionState
          (FunctionExecutionStateMachine *this)

{
  bool bVar1;
  FunctionBody *pFVar2;
  FunctionExecutionStateMachine *this_local;
  
  pFVar2 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
  bVar1 = FunctionBody::DoInterpreterProfile(pFVar2);
  if (bVar1) {
    pFVar2 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
    bVar1 = FunctionBody::DoInterpreterAutoProfile(pFVar2);
    if (bVar1) {
      VerifyExecutionMode(this,AutoProfilingInterpreter);
      this_local._7_1_ = AutoProfilingInterpreter0;
    }
    else {
      VerifyExecutionMode(this,ProfilingInterpreter);
      this_local._7_1_ = ProfilingInterpreter0;
    }
  }
  else {
    VerifyExecutionMode(this,Interpreter);
    this_local._7_1_ = Interpreter;
  }
  return this_local._7_1_;
}

Assistant:

FunctionExecutionStateMachine::ExecutionState FunctionExecutionStateMachine::GetDefaultInterpreterExecutionState() const
    {
        if (!owner->DoInterpreterProfile())
        {
            VerifyExecutionMode(ExecutionMode::Interpreter);
            return ExecutionState::Interpreter;
        }
        else if (owner->DoInterpreterAutoProfile())
        {
            VerifyExecutionMode(ExecutionMode::AutoProfilingInterpreter);
            return ExecutionState::AutoProfilingInterpreter0;
        }
        else
        {
            VerifyExecutionMode(ExecutionMode::ProfilingInterpreter);
            return ExecutionState::ProfilingInterpreter0;
        }
    }